

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AudioDataGeneration.cpp
# Opt level: O2

Value * soul::createAudioDataObject
                  (Value *__return_storage_ptr__,ValueView *frames,double sampleRate)

{
  string_view className;
  string_view name;
  double sampleRate_local;
  ValueView local_40;
  
  className._M_str = "soul::AudioFile";
  className._M_len = 0xf;
  sampleRate_local = sampleRate;
  choc::value::createObject(__return_storage_ptr__,className);
  choc::value::ValueView::ValueView(&local_40,frames);
  name._M_str = "frames";
  name._M_len = 6;
  choc::value::Value::addMember<choc::value::ValueView,char_const(&)[11],double&>
            (__return_storage_ptr__,name,&local_40,(char (*) [11])"sampleRate",&sampleRate_local);
  choc::value::Type::deleteAllocatedObjects(&local_40.type);
  return __return_storage_ptr__;
}

Assistant:

choc::value::Value createAudioDataObject (const choc::value::ValueView& frames, double sampleRate)
{
    return choc::value::createObject ("soul::AudioFile",
                                      "frames", frames,
                                      "sampleRate", sampleRate);
}